

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O3

bool __thiscall ithipublisher::PublishDataM5(ithipublisher *this,FILE *F)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ithipublisher *this_00;
  long lVar5;
  vector<double,_std::allocator<double>_> mvec;
  vector<double,_std::allocator<double>_> local_48;
  
  fwrite("\"M5\" : [",8,1,(FILE *)F);
  lVar5 = 0;
  do {
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    GetVector(this,(char *)((long)&DAT_001c466c + (long)*(int *)((long)&DAT_001c466c + lVar5)),
              (char *)0x0,&local_48);
    if (lVar5 == 0) {
      bVar1 = true;
    }
    else {
      iVar3 = fprintf((FILE *)F,",\n");
      bVar1 = 0 < iVar3;
    }
    bVar2 = false;
    this_00 = (ithipublisher *)F;
    iVar3 = fprintf((FILE *)F,"{ \"v\" : ");
    if ((bVar1) && (0 < iVar3)) {
      bVar2 = PrintVector(this_00,F,&local_48,1.0);
    }
    iVar3 = fprintf((FILE *)F,"}");
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x88);
  iVar4 = fprintf((FILE *)F,"]\n");
  return (bool)(0 < iVar4 & bVar2 & 0 < iVar3);
}

Assistant:

bool ithipublisher::PublishDataM5(FILE * F)
{
    bool ret = true;
    const char * subMet[] = { "M5.1.1", "M5.1.2", "M5.1.3", "M5.1.4", "M5.1.5", "M5.1.6",
        "M5.2.1", "M5.2.2", "M5.2.3", "M5.3.1", "M5.3.2", "M5.4.1", "M5.4.2", "M5.5",
        "M5.6.1", "M5.6.2", "M5.6.3", "M5.6.4", "M5.6.5", "M5.6.6", "M5.6.7", "M5.6.8",
        "M5.6.9", "M5.6.10", "M5.6.11", "M5.6.12", "M5.6.13", "M5.6.14", "M5.6.15", "M5.6.16",
        "M5.7.1", "M5.7.2", "M5.7.9", "M5.7.10"
    };
    const size_t nbSubMet = sizeof(subMet) / sizeof(const char *);

    ret &= fprintf(F, "\"M5\" : [") > 0;

    for (size_t i=0; i<nbSubMet; i++) {
        std::vector<double> mvec;

        ret = GetVector(subMet[i], NULL, &mvec);

        if (i != 0) {
            ret &= fprintf(F, ",\n") > 0;
        }

        ret &= fprintf(F, "{ \"v\" : ") > 0;

        if (ret)
        {
            ret = PrintVector(F, &mvec, 1.0);
        }

        ret &= fprintf(F, "}") > 0;
    }
    ret &= fprintf(F, "]\n") > 0;

    return ret;
}